

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatawidgetmapper.cpp
# Opt level: O0

void __thiscall QDataWidgetMapperPrivate::commitData(QDataWidgetMapperPrivate *this,QWidget *w)

{
  int iVar1;
  vector<QDataWidgetMapperPrivate::WidgetMapper,_std::allocator<QDataWidgetMapperPrivate::WidgetMapper>_>
  *in_RSI;
  QDataWidgetMapperPrivate *in_RDI;
  WidgetMapper *unaff_retaddr;
  QDataWidgetMapperPrivate *in_stack_00000008;
  int idx;
  undefined4 in_stack_ffffffffffffffe8;
  
  if ((in_RDI->submitPolicy != ManualSubmit) && (iVar1 = findWidget(in_RDI,w), iVar1 != -1)) {
    std::
    vector<QDataWidgetMapperPrivate::WidgetMapper,_std::allocator<QDataWidgetMapperPrivate::WidgetMapper>_>
    ::operator[](in_RSI,CONCAT44(iVar1,in_stack_ffffffffffffffe8));
    commit(in_stack_00000008,unaff_retaddr);
  }
  return;
}

Assistant:

void QDataWidgetMapperPrivate::commitData(QWidget *w)
{
    if (submitPolicy == QDataWidgetMapper::ManualSubmit)
        return;

    int idx = findWidget(w);
    if (idx == -1)
        return; // not our widget

    commit(widgetMap[idx]);
}